

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::DoQuadPoint(CEditor *this,CQuad *pQuad,int QuadIndex,int V)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pID_00;
  CUI *pCVar6;
  IGraphics *pIVar7;
  IInput *pIVar8;
  CUI *pCVar9;
  void *pvVar10;
  byte bVar11;
  int in_ECX;
  long lVar12;
  int in_EDX;
  CUI *in_RSI;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float fVar13;
  float fVar14;
  float x_00;
  float y_00;
  float fVar15;
  float fVar16;
  vec4 vVar17;
  int m_2;
  int m_1;
  float y;
  float x;
  int LineDistance;
  int m;
  float dy_1;
  float dx_1;
  bool IgnoreGrid;
  float dy;
  float dx;
  float py;
  float px;
  float wy;
  float wx;
  void *pID;
  CQuadItem QuadItem;
  vec4 pointColor;
  CQuadItem QuadItem_1;
  void *in_stack_ffffffffffffff08;
  CQuadItem *this_00;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  CUI *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff38;
  uint local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  int local_b0;
  CQuadItem local_68;
  vec4 local_58;
  vec4 local_48;
  vec4 local_38;
  vector4_base<float> local_28;
  CQuadItem local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pID_00 = (void *)((long)in_RSI->m_aClips + (long)in_ECX * 8 + -0x58);
  pCVar6 = UI(in_RDI);
  fVar13 = CUI::MouseWorldX(pCVar6);
  pCVar6 = UI(in_RDI);
  fVar14 = CUI::MouseWorldY(pCVar6);
  x_00 = fx2f(*(int *)((long)in_RSI->m_aClips + (long)in_ECX * 8 + -0x58));
  y_00 = fx2f(*(int *)((long)in_RSI->m_aClips + (long)in_ECX * 8 + -0x54));
  fVar15 = (x_00 - fVar13) / in_RDI->m_WorldZoom;
  fVar16 = (y_00 - fVar14) / in_RDI->m_WorldZoom;
  if (fVar15 * fVar15 + fVar16 * fVar16 < 50.0) {
    pCVar6 = UI(in_RDI);
    CUI::SetHotItem(pCVar6,pID_00);
  }
  bVar11 = (byte)in_ECX;
  if ((in_RDI->m_SelectedQuad == in_EDX) && ((in_RDI->m_SelectedPoints & 1 << (bVar11 & 0x1f)) != 0)
     ) {
    pIVar7 = Graphics(in_RDI);
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x21])(0,0,0,0x3f800000);
    IGraphics::CQuadItem::CQuadItem
              (&local_18,x_00,y_00,in_RDI->m_WorldZoom * 7.0,in_RDI->m_WorldZoom * 7.0);
    pIVar7 = Graphics(in_RDI);
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,&local_18,1);
  }
  pIVar8 = Input(in_RDI);
  uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x162);
  if ((uVar3 & 1) == 0) {
    pIVar8 = Input(in_RDI);
    uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x166);
    if ((uVar3 & 1) != 0) goto LAB_001ef7de;
    bVar2 = false;
  }
  else {
LAB_001ef7de:
    bVar2 = true;
  }
  vector4_base<float>::vector4_base(&local_28);
  pCVar6 = UI(in_RDI);
  bVar1 = CUI::CheckActiveItem(pCVar6,pID_00);
  if (bVar1) {
    fVar15 = in_RDI->m_MouseDeltaWx;
    fVar16 = in_RDI->m_MouseDeltaWy;
    if (((DoQuadPoint::s_Moved & 1U) == 0) && (0.5 < fVar15 * fVar15 + fVar16 * fVar16)) {
      DoQuadPoint::s_Moved = true;
    }
    if ((DoQuadPoint::s_Moved & 1U) != 0) {
      if (DoQuadPoint::s_Operation == 1) {
        if (((in_RDI->m_GridActive & 1U) == 0) || (bVar2)) {
          for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
            if ((in_RDI->m_SelectedPoints & 1 << ((byte)local_c0 & 0x1f)) != 0) {
              iVar4 = f2fx(fVar15);
              *(int *)((long)in_RSI->m_aClips + (long)local_c0 * 8 + -0x58) =
                   iVar4 + *(int *)((long)in_RSI->m_aClips + (long)local_c0 * 8 + -0x58);
              iVar4 = f2fx(fVar16);
              *(int *)((long)in_RSI->m_aClips + (long)local_c0 * 8 + -0x54) =
                   iVar4 + *(int *)((long)in_RSI->m_aClips + (long)local_c0 * 8 + -0x54);
            }
          }
        }
        else {
          for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
            if ((in_RDI->m_SelectedPoints & 1 << ((byte)local_b0 & 0x1f)) != 0) {
              iVar4 = GetLineDistance(in_RDI);
              if (fVar13 < 0.0) {
                iVar5 = (int)((fVar13 - (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                             (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
              }
              else {
                iVar5 = (int)((fVar13 + (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                             (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
              }
              local_b8 = (float)iVar5;
              if (fVar14 < 0.0) {
                iVar4 = (int)((fVar14 - (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                             (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
              }
              else {
                iVar4 = (int)((fVar14 + (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                             (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
              }
              local_bc = (float)iVar4;
              iVar4 = f2fx(local_b8);
              *(int *)((long)in_RSI->m_aClips + (long)local_b0 * 8 + -0x58) = iVar4;
              iVar4 = f2fx(local_bc);
              *(int *)((long)in_RSI->m_aClips + (long)local_b0 * 8 + -0x54) = iVar4;
            }
          }
        }
      }
      else if (DoQuadPoint::s_Operation == 2) {
        for (local_c4 = 0; (int)local_c4 < 4; local_c4 = local_c4 + 1) {
          if ((in_RDI->m_SelectedPoints & 1 << ((byte)local_c4 & 0x1f)) != 0) {
            iVar4 = f2fx(fVar15 * 0.001);
            (&in_RSI->m_aClips[1].x)[(long)(int)local_c4 * 2] =
                 (float)(iVar4 + (int)(&in_RSI->m_aClips[1].x)[(long)(int)local_c4 * 2]);
            iVar4 = f2fx(fVar15 * 0.001);
            lVar12 = (long)((int)(local_c4 + 2) % 4);
            (&in_RSI->m_aClips[1].x)[lVar12 * 2] =
                 (float)(iVar4 + (int)(&in_RSI->m_aClips[1].x)[lVar12 * 2]);
            in_stack_ffffffffffffff20 = in_RSI;
            iVar4 = f2fx(fVar16 * 0.001);
            (&in_RSI->m_aClips[1].y)[(long)(int)local_c4 * 2] =
                 (float)(iVar4 + (int)(&in_RSI->m_aClips[1].y)[(long)(int)local_c4 * 2]);
            iVar4 = f2fx(fVar16 * 0.001);
            (&in_RSI->m_aClips[1].y)[(long)(int)(local_c4 ^ 1) * 2] =
                 (float)(iVar4 + (int)(&in_RSI->m_aClips[1].y)[(long)(int)(local_c4 ^ 1) * 2]);
          }
        }
      }
    }
    if (DoQuadPoint::s_Operation == 3) {
      pCVar6 = UI(in_RDI);
      bVar2 = CUI::MouseButton(pCVar6,1);
      if (!bVar2) {
        pCVar6 = UI(in_RDI);
        pCVar9 = UI(in_RDI);
        fVar13 = CUI::MouseX(pCVar9);
        in_stack_ffffffffffffff1c = (int)fVar13;
        pCVar9 = UI(in_RDI);
        CUI::MouseY(pCVar9);
        CUI::DoPopupMenu(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18,(int)((ulong)pCVar6 >> 0x20),(int)pCVar6,
                         in_stack_ffffffffffffff08,(_func_bool_void_ptr_CUIRect *)in_RDI,
                         in_stack_ffffffffffffff38);
        pCVar6 = UI(in_RDI);
        CUI::SetActiveItem(pCVar6,(void *)0x0);
      }
    }
    else {
      pCVar6 = UI(in_RDI);
      bVar2 = CUI::MouseButton(pCVar6,0);
      if (!bVar2) {
        if ((DoQuadPoint::s_Moved & 1U) == 0) {
          pIVar8 = Input(in_RDI);
          uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x161);
          if ((uVar3 & 1) == 0) {
            pIVar8 = Input(in_RDI);
            uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x165);
            if ((uVar3 & 1) == 0) {
              in_RDI->m_SelectedPoints = 1 << (bVar11 & 0x1f);
              goto LAB_001efdd0;
            }
          }
          in_RDI->m_SelectedPoints = 1 << (bVar11 & 0x1f) ^ in_RDI->m_SelectedPoints;
        }
LAB_001efdd0:
        in_RDI->m_LockMouse = false;
        pCVar6 = UI(in_RDI);
        CUI::SetActiveItem(pCVar6,(void *)0x0);
      }
    }
    Config(in_RDI);
    vVar17 = HexToRgba(in_stack_ffffffffffffff1c);
    local_38._0_8_ = vVar17._0_8_;
    local_28.field_0 = local_38.field_0;
    local_28.field_1 = local_38.field_1;
    local_38._8_8_ = vVar17._8_8_;
    local_28.field_2 = local_38.field_2;
    local_28.field_3 = local_38.field_3;
    local_38 = vVar17;
    goto LAB_001f0149;
  }
  pCVar6 = UI(in_RDI);
  pvVar10 = CUI::HotItem(pCVar6);
  if (pvVar10 != pID_00) {
    Config(in_RDI);
    vVar17 = HexToRgba(in_stack_ffffffffffffff1c);
    local_58._0_8_ = vVar17._0_8_;
    local_28.field_0 = local_58.field_0;
    local_28.field_1 = local_58.field_1;
    local_58._8_8_ = vVar17._8_8_;
    local_28.field_2 = local_58.field_2;
    local_28.field_3 = local_58.field_3;
    local_58 = vVar17;
    goto LAB_001f0149;
  }
  ms_pUiGotContext = pID_00;
  Config(in_RDI);
  vVar17 = HexToRgba(in_stack_ffffffffffffff1c);
  local_48._0_8_ = vVar17._0_8_;
  local_28.field_0 = local_48.field_0;
  local_28.field_1 = local_48.field_1;
  local_48._8_8_ = vVar17._8_8_;
  local_28.field_2 = local_48.field_2;
  local_28.field_3 = local_48.field_3;
  in_RDI->m_pTooltip =
       "Left mouse button to move. Hold shift to move the texture. Hold alt to ignore grid.";
  local_48 = vVar17;
  pCVar6 = UI(in_RDI);
  bVar2 = CUI::MouseButton(pCVar6,0);
  if (!bVar2) {
    pCVar6 = UI(in_RDI);
    bVar2 = CUI::MouseButton(pCVar6,1);
    if (!bVar2) goto LAB_001f0149;
    DoQuadPoint::s_Operation = 3;
    in_RDI->m_SelectedQuad = in_EDX;
    pCVar6 = UI(in_RDI);
    CUI::SetActiveItem(pCVar6,pID_00);
    if ((in_RDI->m_SelectedPoints & 1 << (bVar11 & 0x1f)) != 0) goto LAB_001f0149;
    pIVar8 = Input(in_RDI);
    uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x161);
    if ((uVar3 & 1) == 0) {
      pIVar8 = Input(in_RDI);
      uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x165);
      if ((uVar3 & 1) != 0) goto LAB_001f00b8;
      in_RDI->m_SelectedPoints = 1 << (bVar11 & 0x1f);
    }
    else {
LAB_001f00b8:
      in_RDI->m_SelectedPoints = 1 << (bVar11 & 0x1f) | in_RDI->m_SelectedPoints;
    }
    DoQuadPoint::s_Moved = true;
    goto LAB_001f0149;
  }
  pCVar6 = UI(in_RDI);
  CUI::SetActiveItem(pCVar6,pID_00);
  DoQuadPoint::s_Moved = false;
  pIVar8 = Input(in_RDI);
  uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x161);
  if ((uVar3 & 1) == 0) {
    pIVar8 = Input(in_RDI);
    uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x165);
    if ((uVar3 & 1) != 0) goto LAB_001eff31;
    DoQuadPoint::s_Operation = 1;
  }
  else {
LAB_001eff31:
    DoQuadPoint::s_Operation = 2;
    in_RDI->m_LockMouse = true;
  }
  if ((in_RDI->m_SelectedPoints & 1 << (bVar11 & 0x1f)) == 0) {
    pIVar8 = Input(in_RDI);
    uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x161);
    if ((uVar3 & 1) == 0) {
      pIVar8 = Input(in_RDI);
      uVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x165);
      if ((uVar3 & 1) != 0) goto LAB_001effaf;
      in_RDI->m_SelectedPoints = 1 << (bVar11 & 0x1f);
    }
    else {
LAB_001effaf:
      in_RDI->m_SelectedPoints = 1 << (bVar11 & 0x1f) | in_RDI->m_SelectedPoints;
    }
    DoQuadPoint::s_Moved = true;
  }
  in_RDI->m_SelectedQuad = in_EDX;
LAB_001f0149:
  pIVar7 = Graphics(in_RDI);
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x21])
            (local_28._0_8_ & 0xffffffff,(ulong)local_28._0_8_ >> 0x20,local_28.field_2.z,
             local_28.field_3.w);
  fVar13 = in_RDI->m_WorldZoom * 5.0;
  this_00 = &local_68;
  IGraphics::CQuadItem::CQuadItem(this_00,x_00,y_00,fVar13,fVar13);
  pIVar7 = Graphics(in_RDI);
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,this_00,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuadPoint(CQuad *pQuad, int QuadIndex, int V)
{
	void *pID = &pQuad->m_aPoints[V];

	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	float px = fx2f(pQuad->m_aPoints[V].x);
	float py = fx2f(pQuad->m_aPoints[V].y);

	float dx = (px - wx)/m_WorldZoom;
	float dy = (py - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	// draw selection background
	if(m_SelectedQuad == QuadIndex && m_SelectedPoints&(1<<V))
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(px, py, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	enum
	{
		OP_NONE=0,
		OP_MOVEPOINT,
		OP_MOVEUV,
		OP_CONTEXT_MENU
	};

	static bool s_Moved;
	static int s_Operation = OP_NONE;

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	vec4 pointColor;

	if(UI()->CheckActiveItem(pID))
	{
		float dx = m_MouseDeltaWx;
		float dy = m_MouseDeltaWy;
		if(!s_Moved)
		{
			if(dx*dx+dy*dy > 0.5f)
				s_Moved = true;
		}

		if(s_Moved)
		{
			if(s_Operation == OP_MOVEPOINT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					for(int m = 0; m < 4; m++)
						if(m_SelectedPoints&(1<<m))
						{
							int LineDistance = GetLineDistance();

							float x = 0.0f;
							float y = 0.0f;
							if(wx >= 0)
								x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							else
								x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							if(wy >= 0)
								y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							else
								y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

							pQuad->m_aPoints[m].x = f2fx(x);
							pQuad->m_aPoints[m].y = f2fx(y);
						}
				}
				else
				{
					for(int m = 0; m < 4; m++)
						if(m_SelectedPoints&(1<<m))
						{
							pQuad->m_aPoints[m].x += f2fx(dx);
							pQuad->m_aPoints[m].y += f2fx(dy);
						}
				}
			}
			else if(s_Operation == OP_MOVEUV)
			{
				for(int m = 0; m < 4; m++)
					if(m_SelectedPoints&(1<<m))
					{
						// 0,2;1,3 - line x
						// 0,1;2,3 - line y

						pQuad->m_aTexcoords[m].x += f2fx(dx*0.001f);
						pQuad->m_aTexcoords[(m+2)%4].x += f2fx(dx*0.001f);

						pQuad->m_aTexcoords[m].y += f2fx(dy*0.001f);
						pQuad->m_aTexcoords[m^1].y += f2fx(dy*0.001f);
					}
			}
		}

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 150, this, PopupPoint);
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				if(!s_Moved)
				{
					if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
						m_SelectedPoints ^= 1<<V;
					else
						m_SelectedPoints = 1<<V;
				}
				m_LockMouse = false;
				UI()->SetActiveItem(0);
			}
		}

		pointColor = HexToRgba(Config()->m_EdColorQuadPointActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		pointColor = HexToRgba(Config()->m_EdColorQuadPointHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move the texture. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			UI()->SetActiveItem(pID);
			s_Moved = false;
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
			{
				s_Operation = OP_MOVEUV;
				m_LockMouse = true;
			}
			else
				s_Operation = OP_MOVEPOINT;

			if(!(m_SelectedPoints&(1<<V)))
			{
				if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
					m_SelectedPoints |= 1<<V;
				else
					m_SelectedPoints = 1<<V;
				s_Moved = true;
			}

			m_SelectedQuad = QuadIndex;
		}
		else if(UI()->MouseButton(1))
		{
			s_Operation = OP_CONTEXT_MENU;
			m_SelectedQuad = QuadIndex;
			UI()->SetActiveItem(pID);
			if(!(m_SelectedPoints&(1<<V)))
			{
				if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
					m_SelectedPoints |= 1<<V;
				else
					m_SelectedPoints = 1<<V;
				s_Moved = true;
			}
		}
	}
	else
		pointColor = HexToRgba(Config()->m_EdColorQuadPoint);

	Graphics()->SetColor(pointColor.r, pointColor.g, pointColor.b, pointColor.a);
	IGraphics::CQuadItem QuadItem(px, py, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}